

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_paddusb_mips64(uint64_t fs,uint64_t ft)

{
  long lVar1;
  uint8_t uVar2;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    uVar2 = (uint8_t)((uint)vt.ub[lVar1] + (uint)vs.ub[lVar1]);
    if (0xfe < (uint)vt.ub[lVar1] + (uint)vs.ub[lVar1]) {
      uVar2 = 0xff;
    }
    vs.ub[lVar1] = uVar2;
  }
  return vs.d;
}

Assistant:

uint64_t helper_paddusb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.ub[i] + vt.ub[i];
        vs.ub[i] = SATUB(r);
    }
    return vs.d;
}